

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutGetCones(If_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  If_Obj_t *pObj_00;
  If_Cut_t *pCut;
  abctime aVar3;
  abctime clk;
  int Counter;
  int i;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  clk._0_4_ = 0;
  aVar2 = Abc_Clock();
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p->vObjs), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    pObj_00 = (If_Obj_t *)Vec_PtrEntry(p->vObjs,clk._4_4_);
    iVar1 = If_ObjIsAnd(pObj_00);
    if ((iVar1 != 0) && (pObj_00->nRefs != 0)) {
      pCut = If_ObjCutBest(pObj_00);
      iVar1 = If_CutGetCone_rec(p,pObj_00,pCut);
      clk._0_4_ = ((iVar1 != 0 ^ 0xffU) & 1) + (uint)clk;
    }
  }
  Abc_Print(1,"Cound not find boundary for %d nodes.\n",(ulong)(uint)clk);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Cones",aVar3 - aVar2);
  return 1;
}

Assistant:

int If_CutGetCones( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i, Counter = 0;
    abctime clk = Abc_Clock();
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            Counter += !If_CutGetCone_rec( p, pObj, If_ObjCutBest(pObj) );
//            Abc_Print( 1, "%d ", If_CutGetCutMinLevel( p, If_ObjCutBest(pObj) ) );
        }
    }
    Abc_Print( 1, "Cound not find boundary for %d nodes.\n", Counter );
    Abc_PrintTime( 1, "Cones", Abc_Clock() - clk );
    return 1;
}